

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

prevector<16U,_unsigned_char,_unsigned_int,_int> * __thiscall
prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
          (prevector<16U,_unsigned_char,_unsigned_int,_int> *this,
          prevector<16U,_unsigned_char,_unsigned_int,_int> *other)

{
  long lVar1;
  undefined4 uVar2;
  size_type sVar3;
  undefined4 uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (0x10 < this->_size) {
    free((this->_union).indirect_contents.indirect);
  }
  uVar2 = *(undefined4 *)((long)&other->_union + 4);
  sVar3 = (other->_union).indirect_contents.capacity;
  uVar4 = *(undefined4 *)((long)&other->_union + 0xc);
  *(undefined4 *)&this->_union = *(undefined4 *)&other->_union;
  *(undefined4 *)((long)&this->_union + 4) = uVar2;
  (this->_union).indirect_contents.capacity = sVar3;
  *(undefined4 *)((long)&this->_union + 0xc) = uVar4;
  this->_size = other->_size;
  other->_size = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

prevector& operator=(prevector<N, T, Size, Diff>&& other) noexcept {
        if (!is_direct()) {
            free(_union.indirect_contents.indirect);
        }
        _union = std::move(other._union);
        _size = other._size;
        other._size = 0;
        return *this;
    }